

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_bss_decoder.hpp
# Opt level: O0

void __thiscall duckdb::BssDecoder::Skip<float>(BssDecoder *this,uint32_t batch_size)

{
  ostream *poVar1;
  runtime_error *this_00;
  int in_ESI;
  long in_RDI;
  stringstream error;
  uint64_t in_stack_fffffffffffffe08;
  ByteBuffer *in_stack_fffffffffffffe10;
  string local_1c8 [48];
  stringstream local_198 [16];
  ostream local_188 [380];
  int local_c;
  
  if ((*(ulong *)(in_RDI + 8) & 3) != 0) {
    ::std::__cxx11::stringstream::stringstream(local_198);
    poVar1 = ::std::operator<<(local_188,"Data buffer size for the BYTE_STREAM_SPLIT encoding (");
    poVar1 = (ostream *)::std::ostream::operator<<(poVar1,*(ulong *)(in_RDI + 8));
    poVar1 = ::std::operator<<(poVar1,") should be a multiple of the type size (");
    poVar1 = (ostream *)::std::ostream::operator<<(poVar1,4);
    ::std::operator<<(poVar1,")");
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::stringstream::str();
    ::std::runtime_error::runtime_error(this_00,local_1c8);
    __cxa_throw(this_00,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
  }
  local_c = in_ESI;
  ByteBuffer::available(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
  *(int *)(in_RDI + 0x10) = local_c + *(int *)(in_RDI + 0x10);
  return;
}

Assistant:

void Skip(uint32_t batch_size) {
		if (buffer_.len % sizeof(T) != 0) {
			std::stringstream error;
			error << "Data buffer size for the BYTE_STREAM_SPLIT encoding (" << buffer_.len
			      << ") should be a multiple of the type size (" << sizeof(T) << ")";
			throw std::runtime_error(error.str());
		}
		buffer_.available((value_offset_ + batch_size) * sizeof(T));
		value_offset_ += batch_size;
	}